

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

basic_appender<char>
fmt::v11::detail::fill_n<fmt::v11::basic_appender<char>,unsigned_int,char>
          (basic_appender<char> out,uint count,char *value)

{
  bool bVar1;
  basic_appender<char> local_28;
  
  while (bVar1 = count != 0, count = count - 1, bVar1) {
    local_28.container = out.container;
    basic_appender<char>::operator=(&local_28,*value);
  }
  return (basic_appender<char>)out.container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}